

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_int>::on_chr
          (int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  char local_1;
  
  buffer<char>::push_back((this->out).container,&local_1);
  return;
}

Assistant:

void on_chr() { *out++ = static_cast<Char>(abs_value); }